

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ToInt32SatFree(JSContext *ctx,int *pres,JSValue val)

{
  double dVar1;
  int iVar2;
  uint in_ECX;
  undefined8 in_RDX;
  int *in_RSI;
  JSValue JVar3;
  double d;
  int ret;
  uint32_t tag;
  undefined1 in_stack_ffffffffffffffa8 [12];
  int local_30;
  int local_18;
  undefined4 uStack_14;
  uint local_10;
  
  local_18 = (int)in_RDX;
  uStack_14 = (undefined4)((ulong)in_RDX >> 0x20);
  local_10 = in_ECX;
  do {
    if (local_10 < 4) {
      local_30 = local_18;
LAB_00132c1e:
      *in_RSI = local_30;
      return 0;
    }
    if (local_10 == 6) {
      *in_RSI = 0;
      return -1;
    }
    if (local_10 == 7) {
      dVar1 = (double)CONCAT44(uStack_14,local_18);
      if (NAN(dVar1)) {
        local_30 = 0;
      }
      else if (-2147483648.0 <= dVar1) {
        if (dVar1 <= 2147483647.0) {
          local_30 = (int)dVar1;
        }
        else {
          local_30 = 0x7fffffff;
        }
      }
      else {
        local_30 = -0x80000000;
      }
      goto LAB_00132c1e;
    }
    JVar3.tag._4_4_ = local_10;
    JVar3._0_12_ = in_stack_ffffffffffffffa8;
    JVar3 = JS_ToNumberFree((JSContext *)0x132bd2,JVar3);
    local_18 = JVar3.u._0_4_;
    uStack_14 = JVar3.u._4_4_;
    local_10 = (uint)JVar3.tag;
    iVar2 = JS_IsException(JVar3);
    if (iVar2 != 0) {
      *in_RSI = 0;
      return -1;
    }
  } while( true );
}

Assistant:

static int JS_ToInt32SatFree(JSContext *ctx, int *pres, JSValue val)
{
    uint32_t tag;
    int ret;

 redo:
    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
    case JS_TAG_INT:
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
    case JS_TAG_UNDEFINED:
        ret = JS_VALUE_GET_INT(val);
        break;
    case JS_TAG_EXCEPTION:
        *pres = 0;
        return -1;
    case JS_TAG_FLOAT64:
        {
            double d = JS_VALUE_GET_FLOAT64(val);
            if (isnan(d)) {
                ret = 0;
            } else {
                if (d < INT32_MIN)
                    ret = INT32_MIN;
                else if (d > INT32_MAX)
                    ret = INT32_MAX;
                else
                    ret = (int)d;
            }
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
        {
            JSBigFloat *p = JS_VALUE_GET_PTR(val);
            bf_get_int32(&ret, &p->num, 0);
            JS_FreeValue(ctx, val);
        }
        break;
#endif
    default:
        val = JS_ToNumberFree(ctx, val);
        if (JS_IsException(val)) {
            *pres = 0;
            return -1;
        }
        goto redo;
    }
    *pres = ret;
    return 0;
}